

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_contextual_item_text(nk_context *ctx,char *text,int len,nk_flags alignment)

{
  nk_vec2 item_padding;
  nk_rect bounds_00;
  nk_widget_layout_states len_00;
  float in_ECX;
  nk_style_button *in_RDI;
  nk_user_font *unaff_retaddr;
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_style *style;
  nk_input *in;
  nk_window *win;
  nk_context *in_stack_ffffffffffffff88;
  nk_rect *in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa0;
  nk_style_button *pnVar1;
  nk_flags in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  nk_command_buffer *in_stack_ffffffffffffffc0;
  nk_style_item_data *state_00;
  nk_button_behavior behavior;
  long lVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  nk_bool nVar3;
  
  if (((in_RDI == (nk_style_button *)0x0) || (*(long *)((long)&in_RDI[0x5e].hover.data + 0x10) == 0)
      ) || (*(long *)(*(long *)((long)&in_RDI[0x5e].hover.data + 0x10) + 0xa8) == 0)) {
    nVar3 = 0;
  }
  else {
    lVar2 = *(long *)((long)&in_RDI[0x5e].hover.data + 0x10);
    state_00 = &in_RDI[2].normal.data;
    item_padding.y = in_stack_ffffffffffffffa0;
    item_padding.x = in_stack_ffffffffffffff9c;
    len_00 = nk_widget_fitting(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,item_padding);
    if (len_00 == NK_WIDGET_INVALID) {
      nVar3 = 0;
    }
    else {
      if ((len_00 == NK_WIDGET_ROM) ||
         (pnVar1 = in_RDI, (*(uint *)(*(long *)(lVar2 + 0xa8) + 4) & 0x1000) != 0)) {
        pnVar1 = (nk_style_button *)0x0;
      }
      behavior = (nk_button_behavior)((ulong)pnVar1 >> 0x20);
      bounds_00.y = (float)(int)lVar2;
      bounds_00.w = (float)(int)((ulong)lVar2 >> 0x20);
      bounds_00.x = (float)behavior;
      bounds_00.h = in_ECX;
      nVar3 = nk_do_button_text((nk_flags *)&state_00->color,in_stack_ffffffffffffffc0,bounds_00,
                                in_stack_ffffffffffffffb8,len_00,in_stack_ffffffffffffffb0,behavior,
                                in_RDI,(nk_input *)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                ,unaff_retaddr);
      if (nVar3 == 0) {
        nVar3 = 0;
      }
      else {
        nk_contextual_close((nk_context *)0x12f3ed);
        nVar3 = 1;
      }
    }
  }
  return nVar3;
}

Assistant:

NK_API nk_bool
nk_contextual_item_text(struct nk_context *ctx, const char *text, int len,
nk_flags alignment)
{
struct nk_window *win;
const struct nk_input *in;
const struct nk_style *style;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
state = nk_widget_fitting(&bounds, ctx, style->contextual_button.padding);
if (!state) return nk_false;

in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
if (nk_do_button_text(&ctx->last_widget_state, &win->buffer, bounds,
text, len, alignment, NK_BUTTON_DEFAULT, &style->contextual_button, in, style->font)) {
nk_contextual_close(ctx);
return nk_true;
}
return nk_false;
}